

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O0

Color plot::operator-(Color *lhs,Color *rhs)

{
  Color *rhs_local;
  Color *lhs_local;
  
  Color::Color((Color *)&lhs_local,lhs->r - rhs->r,lhs->g - rhs->g,lhs->b - rhs->b,lhs->a - rhs->a);
  return _lhs_local;
}

Assistant:

inline constexpr Color operator-(Color const& lhs, Color const& rhs) {
    return {
        lhs.r - rhs.r,
        lhs.g - rhs.g,
        lhs.b - rhs.b,
        lhs.a - rhs.a
    };
}